

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  int iVar1;
  int iVar2;
  size_type blockCols;
  const_reference pvVar3;
  const_reference ppQVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar5;
  reference peVar6;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Scalar *pSVar7;
  DenseBase<Eigen::Matrix<double,1,_1,1,1,_1>> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar8;
  Scalar SVar9;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  CVar10;
  NestedExpressionType NVar11;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  CVar12;
  NestedExpressionType NVar13;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1063:17),_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  CVar14;
  Matrix<double,_1,__1,_1,_1,__1> MVar15;
  size_type local_87c;
  size_type local_878;
  size_type local_874;
  NestedExpressionType local_858;
  NestedExpressionType local_850;
  uint local_844;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_840;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_810;
  NestedExpressionType local_7c8;
  NestedExpressionType local_7c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_7b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
  local_7a0;
  NestedExpressionType local_730;
  Type local_728;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>
  local_6f0;
  non_const_type local_6b8;
  NestedExpressionType local_6b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>
  local_6a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_660;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>
  local_600;
  anon_class_16_2_94731f28_for_op local_520;
  ConstRowXpr local_510;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1071:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_4d8;
  undefined1 local_490 [8];
  Matrix<double,_1,__1,_1,_1,__1> jacd;
  ConstRowXpr local_470;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1067:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_438;
  undefined1 local_3f0 [8];
  Matrix<double,_1,__1,_1,_1,__1> jacdd;
  anon_class_8_1_54a39809_for_op aStack_3d8;
  uint j;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1063:17),_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  local_3d0;
  undefined1 local_3c0 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  NestedExpressionType local_3a8;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_3a0;
  NestedExpressionType local_390;
  undefined1 local_380 [8];
  Matrix<double,_1,__1,_1,_1,__1> ypowp1;
  NestedExpressionType local_368;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_360;
  NestedExpressionType local_350;
  undefined1 local_340 [8];
  Matrix<double,_1,__1,_1,_1,__1> ypow;
  undefined1 local_328 [4];
  uint i;
  undefined1 local_2f0 [8];
  Matrix<double,_1,__1,_1,_1,__1> y;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  local_2c8;
  undefined1 local_298 [8];
  Matrix<double,_1,__1,_1,_1,__1> xnorm_adj;
  ConstRowXpr local_280;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_248;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_210;
  ConstRowXpr local_1c0;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_188;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_150;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
  local_d0;
  undefined1 local_50 [8];
  Matrix<double,_1,__1,_1,_1,__1> xnorm;
  uint idx;
  size_type Nt;
  size_type Ns;
  size_type Ns2;
  size_type Ns1;
  size_type Ns0;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicTria<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),0);
  if (*pvVar3 < 2) {
    local_874 = 0;
  }
  else {
    ppQVar4 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,0);
    local_874 = quad::QuadRule::NumPoints(*ppQVar4);
  }
  pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),1);
  if (*pvVar3 < 2) {
    local_878 = 0;
  }
  else {
    ppQVar4 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,1);
    local_878 = quad::QuadRule::NumPoints(*ppQVar4);
  }
  pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                     ((array<unsigned_int,_3UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),2);
  if (*pvVar3 < 2) {
    local_87c = 0;
  }
  else {
    ppQVar4 = std::array<const_lf::quad::QuadRule_*,_3UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_3UL> *)
                         &nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                          .m_storage.m_cols,2);
    local_87c = quad::QuadRule::NumPoints(*ppQVar4);
  }
  blockCols = quad::QuadRule::NumPoints
                        ((QuadRule *)
                         nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                         m_storage.m_data);
  xnorm.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._4_4_ =
       NumRefShapeFunctions((FeHierarchicTria<double> *)nodevals,0);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<unsigned_int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,
             (uint *)((long)&xnorm.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                             m_storage.m_cols + 4));
  IVar8 = extraout_RDX;
  if (2 < (uint)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage
                .m_cols) {
    xnorm.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._0_4_ = 0;
    pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             quad::QuadRule::Points
                       ((QuadRule *)
                        nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_1c0,pDVar5,0);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    array(&local_188,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *
          )&local_1c0);
    pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             quad::QuadRule::Points
                       ((QuadRule *)
                        nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_280,pDVar5,1);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    array(&local_248,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *
          )&local_280);
    Eigen::
    DenseBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::
    unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_>
              (&local_210,&local_248,
               (anon_class_1_0_00000001_for_op *)
               ((long)&xnorm_adj.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_cols + 7));
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::operator/(&local_150,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                 *)&local_188,
                (ArrayBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_210);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>_>
    ::matrix(&local_d0,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
              *)&local_150);
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
              ((Matrix<double,1,_1,1,1,_1> *)local_50,
               (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1038:61),_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                *)&local_d0);
    peVar6 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                       ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                        &nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                         m_storage.m_cols,0);
    if (*peVar6 == positive) {
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix
                ((Matrix<double,_1,__1,_1,_1,__1> *)local_298,
                 (Matrix<double,_1,__1,_1,_1,__1> *)local_50);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones
                ((ConstantReturnType *)
                 &y.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols,
                 (ulong)blockCols);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
      ::operator-(&local_2c8,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                   *)&y.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                      m_cols,(MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_50);
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,1,_1,1,1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_298,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                  *)&local_2c8);
    }
    pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             quad::QuadRule::Points
                       ((QuadRule *)
                        nodevals[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                        m_storage.m_data);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              ((ConstRowXpr *)local_328,pDVar5,1);
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
              ((Matrix<double,1,_1,1,1,_1> *)local_2f0,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)local_328);
    for (ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._4_4_
              = 0;
        ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._4_4_ <
        (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
             m_cols - 2U;
        ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._4_4_ =
             ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols.
             _4_4_ + 1) {
      local_368 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_2f0);
      ypowp1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
           (long)&ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                  m_cols + 4;
      CVar10 = Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>>::
               unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_>
                         ((DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>> *)
                          &local_368,
                          (anon_class_8_1_54a39809_for_op *)
                          &ypowp1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                           m_storage.m_cols);
      local_360 = CVar10;
      NVar11 = (NestedExpressionType)
               Eigen::
               ArrayBase<Eigen::CwiseUnaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>_>
               ::matrix((ArrayBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                         *)&local_360);
      local_350 = NVar11;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_340,
                 (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1054:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>
                  *)&local_350);
      local_3a8 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_2f0);
      psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
           (long)&ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                  m_cols + 4;
      CVar12 = Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>>::
               unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_>
                         ((DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>> *)
                          &local_3a8,
                          (anon_class_8_1_54a39809_for_op *)
                          &psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                           m_storage.m_cols);
      local_3a0 = CVar12;
      NVar13 = (NestedExpressionType)
               Eigen::
               ArrayBase<Eigen::CwiseUnaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>_>
               ::matrix((ArrayBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                         *)&local_3a0);
      local_390 = NVar13;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_380,
                 (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1059:21),_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>
                  *)&local_390);
      aStack_3d8.i = (uint *)((long)&ypow.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                     m_storage.m_cols + 4);
      CVar14 = Eigen::DenseBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
               unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_>
                         ((DenseBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_298,
                          &stack0xfffffffffffffc28);
      local_3d0 = CVar14;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_,Eigen::Matrix<double,1,_1,1,1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_3c0,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1063:17),_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                  *)&local_3d0);
      for (jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols.
           _4_4_ = 0;
          jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols.
          _4_4_ < ((int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                        m_storage.m_cols -
                  ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                  m_cols._4_4_) - 2;
          jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols.
          _4_4_ = jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                  m_cols._4_4_ + 1) {
        pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 quad::QuadRule::Points
                           ((QuadRule *)
                            nodevals[3].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_data);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_470,pDVar5,1);
        jacd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
             (long)&jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                    m_cols + 4;
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
        unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_5_>
                  (&local_438,&local_470,
                   (anon_class_16_2_94731f28_for_op *)
                   &jacd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                    m_cols);
        Eigen::Matrix<double,1,-1,1,1,-1>::
        Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_5_,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                  ((Matrix<double,1,_1,1,1,_1> *)local_3f0,
                   (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1067:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                    *)&local_438);
        pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 quad::QuadRule::Points
                           ((QuadRule *)
                            nodevals[3].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_data);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_510,pDVar5,1);
        local_520.j = (uint *)((long)&jacdd.
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                      .m_storage.m_cols + 4);
        local_520.i = (uint *)((long)&ypow.
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                      .m_storage.m_cols + 4);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
        unaryExpr<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_6_>
                  (&local_4d8,&local_510,&local_520);
        Eigen::Matrix<double,1,-1,1,1,-1>::
        Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToFaceDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_6_,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                  ((Matrix<double,1,_1,1,1,_1> *)local_490,
                   (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1071:56),_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                    *)&local_4d8);
        this_00 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  quad::QuadRule::Weights
                            ((QuadRule *)
                             nodevals[3].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                             m_storage.m_data);
        local_6b8 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(this_00);
        local_6b0.m_matrix =
             (non_const_type)
             Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::
             array((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                   &local_6b8);
        Eigen::DenseBase<Eigen::Matrix<double,1,-1,1,1,-1>>::block<int,unsigned_int>
                  (&local_728,in_RDX,0,(ulong)(local_874 + local_878 + local_87c + 3),1,blockCols);
        Eigen::
        MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>::
        array(&local_6f0,
              (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>
               *)&local_728);
        Eigen::
        ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
        ::operator*(&local_6a8,
                    (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                     *)&local_6b0,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>
                     *)&local_6f0);
        local_730 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_3c0);
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,-1,-1,false>const>const>>
        ::operator*(&local_660,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,_1,_1,false>const>const>>
                     *)&local_6a8,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                     *)&local_730);
        local_7c0 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_380);
        local_7c8 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_3f0);
        Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>>::operator*
                  (&local_7b8,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>> *)
                   &local_7c0,
                   (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *
                   )&local_7c8);
        local_844 = ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                    m_cols._4_4_ * 2 + 4;
        local_850 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_340);
        Eigen::operator*(&local_840,&local_844,(StorageBaseType *)&local_850);
        local_858 = (NestedExpressionType)
                    Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                              ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_490);
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
        ::operator*(&local_810,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                     *)&local_840,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                     *)&local_858);
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
        ::operator-(&local_7a0,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                     *)&local_7b8,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                     *)&local_810);
        Eigen::
        ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,-1,-1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
        ::operator*(&local_600,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,_1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                     *)&local_660,
                    (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>
                     *)&local_7a0);
        SVar9 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>_>_>_>
                ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>_>_>
                       *)&local_600);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(uint)xnorm.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                         .m_storage.m_cols);
        *pSVar7 = SVar9;
        iVar1 = ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
                ._4_4_ * 2;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(uint)xnorm.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                         .m_storage.m_cols);
        *pSVar7 = *pSVar7 * (double)(iVar1 + 3);
        iVar2 = ypow.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
                ._4_4_ * 2;
        iVar1 = jacdd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                m_cols._4_4_ * 2;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(uint)xnorm.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                         .m_storage.m_cols);
        *pSVar7 = (double)(uint)(iVar2 + 5 + iVar1) * *pSVar7;
        xnorm.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols._0_4_
             = (uint)xnorm.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                     m_cols + 1;
        Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix
                  ((Matrix<double,_1,__1,_1,_1,__1> *)local_490);
        Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix
                  ((Matrix<double,_1,__1,_1,_1,__1> *)local_3f0);
      }
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_3c0);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_380);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_340);
    }
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_2f0);
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_298);
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_50);
    IVar8 = extraout_RDX_00;
  }
  MVar15.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar8;
  MVar15.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar15.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToFaceDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Ns = Ns0 + Ns1 + Ns2;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions(0));
    if (interior_degree_ > 2) {
      unsigned idx = 0;
      const Eigen::Matrix<double, 1, Eigen::Dynamic> xnorm =
          (qr_dual_tria_->Points().row(0).array() /
           qr_dual_tria_->Points().row(1).array().unaryExpr([&](double y) {
             return 1 - y;
           })).matrix();
      // We need to flip the local coordinates in case the
      // relative orientation is negative
      const Eigen::Matrix<double, 1, Eigen::Dynamic> xnorm_adj =
          rel_orient_[0] == lf::mesh::Orientation::positive
              ? xnorm
              : Eigen::RowVectorXd::Ones(Nt) - xnorm;
      const Eigen::Matrix<double, 1, Eigen::Dynamic> y =
          qr_dual_tria_->Points().row(1);
      // i is the degree of the edge function
      for (unsigned i = 0; i < interior_degree_ - 2; ++i) {
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> ypow =
            y.array()
                .unaryExpr(
                    [&](double y) -> SCALAR { return std::pow(1 - y, i); })
                .matrix();
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> ypowp1 =
            y.array()
                .unaryExpr(
                    [&](double y) -> SCALAR { return std::pow(1 - y, i + 1); })
                .matrix();
        const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            xnorm_adj.unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i + 1, x); });
        // j is the degree of the blending Jacobi polynomial
        for (unsigned j = 0; j < interior_degree_ - i - 2; ++j) {
          const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> jacdd =
              qr_dual_tria_->Points().row(1).unaryExpr([&](double y) -> SCALAR {
                return JacobiDx(j, 2 * i + 4, y);
              });
          const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> jacd =
              qr_dual_tria_->Points().row(1).unaryExpr([&](double y) -> SCALAR {
                return IJacobiDx(j + 1, 2 * i + 4, y);
              });
          dofs[idx] =
              (qr_dual_tria_->Weights().transpose().array() *
               nodevals.block(0, 3 + Ns, 1, Nt).array() * psidd.array() *
               (ypowp1.array() * jacdd.array() -
                (2 * i + 4) * ypow.array() * jacd.array()))
                  .sum();
          dofs[idx] *=
              2 * i + 3;  // Normalization factor for the Legendre polynomial
          dofs[idx] *= 2 * j + 2 * i +
                       5;  // Normalization factor for the Jacobi Polynomial
          ++idx;
        }
      }
    }
    return dofs;
  }